

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O1

char * __thiscall
icu_63::CharString::getAppendBuffer
          (CharString *this,int32_t minCapacity,int32_t desiredCapacityHint,int32_t *resultCapacity,
          UErrorCode *errorCode)

{
  uint uVar1;
  UBool UVar2;
  char *pcVar3;
  int iVar4;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = this->len;
    iVar4 = ~uVar1 + (this->buffer).capacity;
    if (iVar4 < minCapacity) {
      UVar2 = ensureCapacity(this,minCapacity + uVar1 + 1,desiredCapacityHint + uVar1 + 1,errorCode)
      ;
      if (UVar2 == '\0') goto LAB_001992f1;
      *resultCapacity = ~this->len + (this->buffer).capacity;
    }
    else {
      *resultCapacity = iVar4;
    }
    pcVar3 = (this->buffer).ptr + this->len;
  }
  else {
LAB_001992f1:
    *resultCapacity = 0;
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

char *CharString::getAppendBuffer(int32_t minCapacity,
                                  int32_t desiredCapacityHint,
                                  int32_t &resultCapacity,
                                  UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        resultCapacity=0;
        return NULL;
    }
    int32_t appendCapacity=buffer.getCapacity()-len-1;  // -1 for NUL
    if(appendCapacity>=minCapacity) {
        resultCapacity=appendCapacity;
        return buffer.getAlias()+len;
    }
    if(ensureCapacity(len+minCapacity+1, len+desiredCapacityHint+1, errorCode)) {
        resultCapacity=buffer.getCapacity()-len-1;
        return buffer.getAlias()+len;
    }
    resultCapacity=0;
    return NULL;
}